

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

h__Writer * __thiscall ASDCP::TimedText::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  bool bVar1;
  long in_RSI;
  h__WriterState local_80 [28];
  h__Writer *this_local;
  
  this_local = this;
  bVar1 = MXF::h__WriterState::Test_RUNNING((h__WriterState *)(in_RSI + 0x370));
  if (bVar1) {
    *(undefined4 *)(in_RSI + 0x338) = *(undefined4 *)(in_RSI + 0x6f8);
    MXF::h__WriterState::Goto_FINAL(local_80);
    Kumu::Result_t::~Result_t((Result_t *)local_80);
    h__ASDCPWriter::WriteASDCPFooter(&this->super_h__ASDCPWriter);
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFWriter::h__Writer::Finalize()
{
  if ( ! m_State.Test_RUNNING() )
    return RESULT_STATE;
  m_FramesWritten = m_TDesc.ContainerDuration;
  m_State.Goto_FINAL();

  return WriteASDCPFooter();
}